

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O1

PktOut * ssh2_portfwd_chanopen
                   (ssh2_connection_state *s,ssh2_channel *c,char *hostname,int port,
                   char *description,SocketPeerInfo *peerinfo)

{
  BinarySink *bs;
  LogContext *ctx;
  char *pcVar1;
  PktOut *pPVar2;
  
  ctx = (s->ppl).logctx;
  pcVar1 = dupprintf("Opening connection to %s:%d for %s",hostname,(ulong)(uint)port,description);
  logevent_and_free(ctx,pcVar1);
  pPVar2 = ssh2_chanopen_init(c,"direct-tcpip");
  pcVar1 = host_strduptrim(hostname);
  bs = pPVar2->binarysink_;
  BinarySink_put_stringz(bs,pcVar1);
  safefree(pcVar1);
  BinarySink_put_uint32(bs,(long)port);
  BinarySink_put_stringz(bs,"0.0.0.0");
  BinarySink_put_uint32(bs,0);
  return pPVar2;
}

Assistant:

PktOut *ssh2_portfwd_chanopen(
    struct ssh2_connection_state *s, struct ssh2_channel *c,
    const char *hostname, int port,
    const char *description, const SocketPeerInfo *peerinfo)
{
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    PktOut *pktout;

    /*
     * In client mode, this function is called by portfwdmgr in
     * response to PortListeners that were set up in
     * portfwdmgr_config, which means that the hostname and port
     * parameters will indicate the host we want to tell the server to
     * connect _to_.
     */

    ppl_logevent("Opening connection to %s:%d for %s",
                 hostname, port, description);

    pktout = ssh2_chanopen_init(c, "direct-tcpip");
    {
        char *trimmed_host = host_strduptrim(hostname);
        put_stringz(pktout, trimmed_host);
        sfree(trimmed_host);
    }
    put_uint32(pktout, port);

    /*
     * We make up values for the originator data; partly it's too much
     * hassle to keep track, and partly I'm not convinced the server
     * should be told details like that about my local network
     * configuration. The "originator IP address" is syntactically a
     * numeric IP address, and some servers (e.g., Tectia) get upset
     * if it doesn't match this syntax.
     */
    put_stringz(pktout, "0.0.0.0");
    put_uint32(pktout, 0);

    return pktout;
}